

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VLinearSumVectorArray(int nvec,realtype a,N_Vector *X,realtype b,N_Vector *Y,N_Vector *Z)

{
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  int ier;
  int i;
  int local_38;
  int local_34;
  
  if (*(long *)(*(long *)(*in_RCX + 8) + 0x100) == 0) {
    for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
      (**(code **)(*(long *)(*in_RCX + 8) + 0x50))
                (in_XMM0_Qa,in_XMM1_Qa,*(undefined8 *)(in_RSI + (long)local_34 * 8),
                 *(undefined8 *)(in_RDX + (long)local_34 * 8),in_RCX[local_34]);
    }
    local_38 = 0;
  }
  else {
    local_38 = (**(code **)(*(long *)(*in_RCX + 8) + 0x100))
                         (in_XMM0_Qa,in_XMM1_Qa,in_EDI,in_RSI,in_RDX,in_RCX);
  }
  return local_38;
}

Assistant:

int N_VLinearSumVectorArray(int nvec, realtype a, N_Vector* X,
                            realtype b, N_Vector* Y, N_Vector* Z)
{
  int i, ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (Z[0]->ops->nvlinearsumvectorarray != NULL) {

    ier = Z[0]->ops->nvlinearsumvectorarray(nvec, a, X, b, Y, Z);

  } else {

    for (i=0; i<nvec; i++) {
      Z[0]->ops->nvlinearsum(a, X[i], b, Y[i], Z[i]);
    }
    ier = 0;

  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return(ier);
}